

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Personality.cpp
# Opt level: O2

void __thiscall Personality::~Personality(Personality *this)

{
  list<Follower_*,_std::allocator<Follower_*>_> *this_00;
  list<Item_*,_std::allocator<Item_*>_> *this_01;
  _List_node_base *p_Var1;
  
  (this->super_BlackCard).super_Card._vptr_Card = (_func_int **)&PTR_effectBonus_001162e0;
  this_00 = &this->followers;
  p_Var1 = (_List_node_base *)this_00;
  while (p_Var1 = (((_List_base<Follower_*,_std::allocator<Follower_*>_> *)&p_Var1->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)this_00) {
    std::__cxx11::list<Follower_*,_std::allocator<Follower_*>_>::remove
              (this_00,(char *)(p_Var1 + 1));
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))();
    }
    p_Var1 = (this_00->super__List_base<Follower_*,_std::allocator<Follower_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  this_01 = &this->items;
  p_Var1 = (_List_node_base *)this_01;
  while (p_Var1 = (((_List_base<Item_*,_std::allocator<Item_*>_> *)&p_Var1->_M_next)->_M_impl).
                  _M_node.super__List_node_base._M_next, p_Var1 != (_List_node_base *)this_01) {
    std::__cxx11::list<Item_*,_std::allocator<Item_*>_>::remove(this_01,(char *)(p_Var1 + 1));
    if (p_Var1[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x18))();
    }
    p_Var1 = (this_01->super__List_base<Item_*,_std::allocator<Item_*>_>)._M_impl._M_node.
             super__List_node_base._M_next;
  }
  std::__cxx11::_List_base<Item_*,_std::allocator<Item_*>_>::_M_clear
            (&this_01->super__List_base<Item_*,_std::allocator<Item_*>_>);
  std::__cxx11::_List_base<Follower_*,_std::allocator<Follower_*>_>::_M_clear
            (&this_00->super__List_base<Follower_*,_std::allocator<Follower_*>_>);
  std::__cxx11::string::~string((string *)&this->name);
  BlackCard::~BlackCard(&this->super_BlackCard);
  return;
}

Assistant:

Personality::~Personality()
{
    list<Follower*>::iterator itf;
    for (itf = followers.begin(); itf != followers.end(); itf++)
    {
        followers.remove((*itf));
        delete *itf;
        itf = followers.begin();
    }

    list<Item*>::iterator iti;
    for (iti = items.begin(); iti != items.end(); iti++)
    {
        items.remove((*iti));
        delete *iti;
        iti = items.begin();
    }
}